

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

void __thiscall
TPZFMatrix<long_double>::Initialize
          (TPZFMatrix<long_double> *this,initializer_list<std::initializer_list<long_double>_> *list
          )

{
  size_type sVar1;
  size_type sVar2;
  iterator plVar3;
  ulong uVar4;
  longdouble *plVar5;
  iterator piVar6;
  long lVar7;
  ulong uVar8;
  iterator piVar9;
  
  sVar1 = list->_M_len;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow = sVar1;
  piVar9 = list->_M_array;
  sVar2 = piVar9->_M_len;
  (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol = sVar2;
  uVar4 = sVar2 * sVar1;
  uVar8 = 0;
  plVar5 = (longdouble *)operator_new__(-(ulong)(uVar4 >> 0x3c != 0) | uVar4 * 0x10);
  this->fElem = plVar5;
  if (sVar1 != 0) {
    piVar6 = piVar9 + sVar1;
    do {
      sVar2 = piVar9->_M_len;
      if (sVar2 != 0) {
        plVar3 = piVar9->_M_array;
        lVar7 = 0;
        uVar4 = 0;
        do {
          plVar5[uVar8 + uVar4 * sVar1] = *(longdouble *)((long)plVar3 + lVar7);
          uVar4 = (ulong)((int)uVar4 + 1);
          lVar7 = lVar7 + 0x10;
        } while (sVar2 << 4 != lVar7);
      }
      piVar9 = piVar9 + 1;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (piVar9 != piVar6);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::Initialize(const  std::initializer_list<std::initializer_list<TVar>> &list) {
    this->fRow = list.size();

    auto row_it = list.begin();
    auto row_it_end = list.end();

#ifdef PZDEBUG
    bool col_n_found = false;
    for (auto it = row_it; it != row_it_end; it++) {
        if (!col_n_found) {
            this->fCol = it->size();
            col_n_found = true;
        } else {
            if (this->fCol != it->size())
                Error("TPZFMatrix constructor: inconsistent number of columns in initializer list");
        }
    }
#else
    this->fCol = row_it->size();
#endif

    this->fElem = new TVar[this->fRow * this->fCol];

    for (uint32_t row_n = 0; row_it != row_it_end; row_it++, row_n++) {
        auto col_it = row_it->begin();
        auto col_it_end = row_it->end();
        for (uint32_t col_n = 0; col_it != col_it_end; col_it++, col_n++) {
            this->fElem[col_n * this->fRow + row_n] = *col_it;
        }
    }
}